

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void codebinNoK(FuncState *fs,BinOpr opr,expdesc *e1,expdesc *e2,int flip,int line)

{
  anon_union_8_6_45a55102_for_u aVar1;
  anon_union_8_6_45a55102_for_u aVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  expkind eVar6;
  undefined4 uVar7;
  int iVar8;
  expdesc temp;
  
  if (flip != 0) {
    iVar4 = e1->t;
    iVar5 = e1->f;
    eVar6 = e1->k;
    uVar7 = *(undefined4 *)&e1->field_0x4;
    aVar1 = e1->u;
    iVar8 = e2->f;
    e1->t = e2->t;
    e1->f = iVar8;
    uVar3 = *(undefined4 *)&e2->field_0x4;
    aVar2 = e2->u;
    e1->k = e2->k;
    *(undefined4 *)&e1->field_0x4 = uVar3;
    e1->u = aVar2;
    e2->t = iVar4;
    e2->f = iVar5;
    e2->k = eVar6;
    *(undefined4 *)&e2->field_0x4 = uVar7;
    e2->u = aVar1;
  }
  iVar8 = luaK_exp2anyreg(fs,e2);
  finishbinexpval(fs,e1,e2,opr + 0x22,iVar8,0,line,OP_MMBIN,opr + OPR_IDIV);
  return;
}

Assistant:

static void codebinNoK (FuncState *fs, BinOpr opr,
                        expdesc *e1, expdesc *e2, int flip, int line) {
  if (flip)
    swapexps(e1, e2);  /* back to original order */
  codebinexpval(fs, opr, e1, e2, line);  /* use standard operators */
}